

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Type * typeof_specifier(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  _Bool _Var1;
  C_Node *node_00;
  C_Token *pCVar2;
  C_Node *node;
  C_Type *ty;
  C_Token *tok_local;
  C_Token **rest_local;
  C_Parser *parser_local;
  
  ty = (C_Type *)tok;
  tok_local = (C_Token *)rest;
  rest_local = (C_Token **)parser;
  ty = (C_Type *)C_skip(parser,tok,"(");
  _Var1 = is_typename((C_Parser *)rest_local,(C_Token *)ty);
  if (_Var1) {
    node = (C_Node *)typename((C_Parser *)rest_local,(C_Token **)&ty,(C_Token *)ty);
  }
  else {
    node_00 = expr((C_Parser *)rest_local,(C_Token **)&ty,(C_Token *)ty);
    C_add_type((C_Parser *)rest_local,node_00);
    node = (C_Node *)node_00->ty;
  }
  pCVar2 = C_skip((C_Parser *)rest_local,(C_Token *)ty,")");
  *(C_Token **)tok_local = pCVar2;
  return (C_Type *)node;
}

Assistant:

static C_Type *typeof_specifier(C_Parser *parser, C_Token **rest, C_Token *tok) {
  tok = C_skip(parser, tok, "(");

  C_Type *ty;
  if (is_typename(parser, tok)) {
    ty = typename(parser, &tok, tok);
  } else {
    C_Node *node = expr(parser, &tok, tok);
    C_add_type(parser, node);
    ty = node->ty;
  }
  *rest = C_skip(parser, tok, ")");
  return ty;
}